

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength>::tryEmplace_impl<unsigned_char*const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<unsigned_char*,QFSFileEnginePrivate::StartAndLength> *this,uchar **key)

{
  uchar uVar1;
  Span *pSVar2;
  long lVar3;
  size_t hash;
  Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *pDVar4;
  Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *pNVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Bucket BVar7;
  Bucket local_50;
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)this;
  if (lVar3 == 0) {
    QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::detach
              ((QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)this);
    lVar3 = *(long *)this;
  }
  local_40.d = (Data *)0x0;
  hash = qHash<unsigned_char_*,_true>(key,*(size_t *)(lVar3 + 0x18));
  BVar7 = QHashPrivate::
          Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>::
          findBucketWithHash<unsigned_char*>
                    (*(Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>
                       **)this,key,hash);
  uVar1 = (BVar7.span)->offsets[BVar7.index];
  pDVar4 = *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **)
            this;
  local_50 = BVar7;
  if ((pDVar4 == (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> *
                 )0x0) || (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_00378a8b:
    QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::operator=
              (&local_40,(QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)this);
    pDVar4 = *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **)
              this;
    if (uVar1 == 0xff) {
      bVar6 = pDVar4->numBuckets >> 1 <= pDVar4->size;
    }
    else {
      bVar6 = false;
    }
    pSVar2 = pDVar4->spans;
    if (bVar6) {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::
               detached(pDVar4,pDVar4->size + 1);
      *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **)this =
           pDVar4;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>::
                 findBucketWithHash<unsigned_char*>
                           ((Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>
                             *)pDVar4,key,hash);
    }
    else {
      pDVar4 = QHashPrivate::
               Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::
               detached(pDVar4);
      *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **)this =
           pDVar4;
      local_50.index._0_4_ = (uint)BVar7.index & 0x7f;
      local_50.span =
           pDVar4->spans + ((((long)BVar7.span - (long)pSVar2) / 0x90 << 7 | BVar7.index) >> 7);
      local_50.index._4_4_ = 0;
    }
    if (uVar1 != 0xff) {
      pDVar4 = *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **
                )this;
      goto LAB_00378b57;
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_00378b57;
    if (pDVar4->numBuckets >> 1 <= pDVar4->size) goto LAB_00378a8b;
  }
  pNVar5 = QHashPrivate::
           Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::Bucket
           ::insert(&local_50);
  pNVar5->key = *key;
  *(undefined8 *)&pNVar5->value = 0;
  (pNVar5->value).length = 0;
  pDVar4 = *(Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_> **)
            this;
  pDVar4->size = pDVar4->size + 1;
LAB_00378b57:
  pSVar2 = pDVar4->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar4;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)local_50.span - (long)pSVar2) / 0x90 << 7 | local_50.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }